

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O2

void __thiscall
perfetto::protos::gen::FtraceDescriptor::FtraceDescriptor
          (FtraceDescriptor *this,FtraceDescriptor *param_1)

{
  pointer pFVar1;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__FtraceDescriptor_00406e68;
  pFVar1 = (param_1->atrace_categories_).
           super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  (this->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (param_1->atrace_categories_).
       super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
       ._M_impl.super__Vector_impl_data._M_start;
  (this->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_finish = pFVar1;
  (this->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (param_1->atrace_categories_).
       super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
       ._M_impl.super__Vector_impl_data._M_end_of_storage;
  (param_1->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (param_1->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (param_1->atrace_categories_).
  super__Vector_base<perfetto::protos::gen::FtraceDescriptor_AtraceCategory,_std::allocator<perfetto::protos::gen::FtraceDescriptor_AtraceCategory>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ::std::__cxx11::string::string
            ((string *)&this->unknown_fields_,(string *)&param_1->unknown_fields_);
  (this->_has_field_).super__Base_bitset<1UL>._M_w =
       (param_1->_has_field_).super__Base_bitset<1UL>._M_w;
  return;
}

Assistant:

FtraceDescriptor::FtraceDescriptor(FtraceDescriptor&&) noexcept = default;